

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O2

void Abc_ObjDeleteFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  
  if (((ulong)pObj & 1) == 0) {
    if (((ulong)pFanin & 1) == 0) {
      if (pObj->pNtk == pFanin->pNtk) {
        if ((-1 < pObj->Id) && (-1 < pFanin->Id)) {
          iVar3 = Vec_IntRemove(&pObj->vFanins,pFanin->Id);
          uVar1 = pObj->Id;
          if (iVar3 == 0) {
            uVar2 = pFanin->Id;
            pcVar4 = "The obj %d is not found among the fanins of obj %d ...\n";
          }
          else {
            iVar3 = Vec_IntRemove(&pFanin->vFanouts,uVar1);
            if (iVar3 != 0) {
              return;
            }
            uVar2 = pObj->Id;
            uVar1 = pFanin->Id;
            pcVar4 = "The obj %d is not found among the fanouts of obj %d ...\n";
          }
          printf(pcVar4,(ulong)uVar2,(ulong)uVar1);
          return;
        }
        pcVar4 = "pObj->Id >= 0 && pFanin->Id >= 0";
        uVar1 = 0x74;
      }
      else {
        pcVar4 = "pObj->pNtk == pFanin->pNtk";
        uVar1 = 0x73;
      }
    }
    else {
      pcVar4 = "!Abc_ObjIsComplement(pFanin)";
      uVar1 = 0x72;
    }
  }
  else {
    pcVar4 = "!Abc_ObjIsComplement(pObj)";
    uVar1 = 0x71;
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                ,uVar1,"void Abc_ObjDeleteFanin(Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_ObjDeleteFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsComplement(pFanin) );
    assert( pObj->pNtk == pFanin->pNtk );
    assert( pObj->Id >= 0 && pFanin->Id >= 0 );
    if ( !Vec_IntRemove( &pObj->vFanins, pFanin->Id ) )
    {
        printf( "The obj %d is not found among the fanins of obj %d ...\n", pFanin->Id, pObj->Id );
        return;
    }
    if ( !Vec_IntRemove( &pFanin->vFanouts, pObj->Id ) )
    {
        printf( "The obj %d is not found among the fanouts of obj %d ...\n", pObj->Id, pFanin->Id );
        return;
    }
}